

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.hh
# Opt level: O2

void __thiscall Pipeline::~Pipeline(Pipeline *this)

{
  this->_vptr_Pipeline = (_func_int **)&PTR__Pipeline_002abaf0;
  std::__cxx11::string::~string((string *)&this->identifier);
  return;
}

Assistant:

virtual ~Pipeline() = default;